

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<QString,QDBusConnectionPrivate::SignalHook>::
emplace_helper<QDBusConnectionPrivate::SignalHook_const&>
          (QMultiHash<QString,_QDBusConnectionPrivate::SignalHook> *this,QString *key,
          SignalHook *args)

{
  long lVar1;
  piter it;
  SignalHook *in_RCX;
  Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *in_RDX;
  MultiNode<QString,_QDBusConnectionPrivate::SignalHook> *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  MultiNode<QString,_QDBusConnectionPrivate::SignalHook> *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>::
  findOrInsert<QString>(in_RDX,&in_RCX->service);
  QHashPrivate::iterator<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_>::
  node((iterator<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *)in_RCX);
  QHashPrivate::MultiNode<QString,QDBusConnectionPrivate::SignalHook>::
  createInPlace<QDBusConnectionPrivate::SignalHook_const&>(n,(QString *)in_RDX,in_RCX);
  (in_RSI->key).d.ptr = (char16_t *)((long)(in_RSI->key).d.ptr + 1);
  it.bucket = (size_t)in_RDX;
  it.d = (Data<QHashPrivate::MultiNode<QString,_QDBusConnectionPrivate::SignalHook>_> *)in_RCX;
  QMultiHash<QString,_QDBusConnectionPrivate::SignalHook>::iterator::iterator
            ((iterator *)in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }